

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O2

int ecx_readstate(ecx_contextt *context)

{
  ulong in_RAX;
  ec_slavet *peVar1;
  ulong uVar2;
  uint16 uVar3;
  ushort uVar4;
  ushort uStack_38;
  ec_alstatust slstat;
  
  peVar1 = context->slavelist;
  peVar1->ALstatuscode = 0;
  uVar2 = 1;
  uVar4 = 0xff;
  _uStack_38 = in_RAX;
  while( true ) {
    uVar2 = uVar2 & 0xffff;
    if (*context->slavecount < (int)uVar2) break;
    _uStack_38 = CONCAT22(0,uStack_38);
    _uStack_38 = _uStack_38 & 0xffffffffffff;
    ecx_FPRD(context->port,peVar1[uVar2].configadr,0x130,6,&slstat,6000);
    peVar1 = context->slavelist;
    peVar1[uVar2].ALstatuscode = slstat.alstatuscode;
    uVar3 = slstat.alstatus;
    if (uVar4 <= slstat.alstatus) {
      uVar3 = uVar4;
    }
    peVar1[uVar2].state = slstat.alstatus;
    peVar1->ALstatuscode = peVar1->ALstatuscode | slstat.alstatuscode;
    uVar2 = (ulong)((int)uVar2 + 1);
    uVar4 = uVar3;
  }
  peVar1->state = uVar4;
  return (int)uVar4;
}

Assistant:

int ecx_readstate(ecx_contextt *context)
{
   uint16 slave, configadr, lowest, rval;
   ec_alstatust slstat;

   lowest = 0xff;
   context->slavelist[0].ALstatuscode = 0;
   for (slave = 1; slave <= *(context->slavecount); slave++)
   {
      configadr = context->slavelist[slave].configadr;
      slstat.alstatus = 0;
      slstat.alstatuscode = 0;
      ecx_FPRD(context->port, configadr, ECT_REG_ALSTAT, sizeof(slstat), &slstat, EC_TIMEOUTRET3);
      rval = etohs(slstat.alstatus);
      context->slavelist[slave].ALstatuscode = etohs(slstat.alstatuscode);
      if (rval < lowest)
      {
         lowest = rval;
      }
      context->slavelist[slave].state = rval;
      context->slavelist[0].ALstatuscode |= context->slavelist[slave].ALstatuscode;
   }
   context->slavelist[0].state = lowest;

   return lowest;
}